

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O1

boolean same_price(obj *obj1,obj *obj2)

{
  monst *pmVar1;
  bill_x *pbVar2;
  bill_x *pbVar3;
  monst *shkp;
  bool bVar4;
  
  pmVar1 = level->monlist;
  while( true ) {
    pmVar1 = next_shkp(pmVar1,'\x01');
    if (pmVar1 == (monst *)0x0) break;
    pbVar2 = onbill(obj1,pmVar1,'\x01');
    if (pbVar2 != (bill_x *)0x0) goto LAB_00239832;
    pmVar1 = pmVar1->nmon;
  }
  pbVar2 = (bill_x *)0x0;
LAB_00239832:
  if ((pmVar1 == (monst *)0x0) ||
     (pbVar3 = onbill(obj2,pmVar1,'\x01'), shkp = pmVar1, pbVar3 == (bill_x *)0x0)) {
    for (shkp = next_shkp(level->monlist,'\x01'); shkp != (monst *)0x0;
        shkp = next_shkp(shkp->nmon,'\x01')) {
      pbVar3 = onbill(obj2,shkp,'\x01');
      if (pbVar3 != (bill_x *)0x0) goto LAB_0023989e;
    }
    pbVar3 = (bill_x *)0x0;
    shkp = (monst *)0x0;
  }
LAB_0023989e:
  if ((pbVar2 == (bill_x *)0x0) || (pbVar3 == (bill_x *)0x0)) {
    bVar4 = false;
    warning("same_price: object wasn\'t on any bill!");
  }
  else if (pmVar1 == shkp) {
    bVar4 = pbVar2->price == pbVar3->price;
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

boolean same_price(struct obj *obj1, struct obj *obj2)
{
	struct monst *shkp1, *shkp2;
	struct bill_x *bp1 = 0, *bp2 = 0;
	boolean are_mergable = FALSE;

	/* look up the first object by finding shk whose bill it's on */
	for (shkp1 = next_shkp(level->monlist, TRUE); shkp1;
		shkp1 = next_shkp(shkp1->nmon, TRUE))
	    if ((bp1 = onbill(obj1, shkp1, TRUE)) != 0) break;
	/* second object is probably owned by same shk; if not, look harder */
	if (shkp1 && (bp2 = onbill(obj2, shkp1, TRUE)) != 0) {
	    shkp2 = shkp1;
	} else {
	    for (shkp2 = next_shkp(level->monlist, TRUE); shkp2;
		    shkp2 = next_shkp(shkp2->nmon, TRUE))
		if ((bp2 = onbill(obj2, shkp2, TRUE)) != 0) break;
	}

	if (!bp1 || !bp2) warning("same_price: object wasn't on any bill!");
	else are_mergable = (shkp1 == shkp2 && bp1->price == bp2->price);
	return are_mergable;
}